

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEditPrivate::verticalScrollbarActionTriggered(QPlainTextEditPrivate *this,int action)

{
  int in_ESI;
  SliderAction a;
  bool in_stack_00000067;
  MoveMode in_stack_00000068;
  MoveOperation in_stack_0000006c;
  QPlainTextEditPrivate *in_stack_00000070;
  
  if (in_ESI == 3) {
    pageUpDown(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000067);
  }
  else if (in_ESI == 4) {
    pageUpDown(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000067);
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::verticalScrollbarActionTriggered(int action) {

    const auto a = static_cast<QAbstractSlider::SliderAction>(action);
    switch (a) {
    case QAbstractSlider::SliderPageStepAdd:
        pageUpDown(QTextCursor::Down, QTextCursor::MoveAnchor, false);
        break;
    case QAbstractSlider::SliderPageStepSub:
        pageUpDown(QTextCursor::Up, QTextCursor::MoveAnchor, false);
        break;
    default:
        break;
    }
}